

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void JX9_DIR_Const(jx9_value *pVal,void *pUserData)

{
  int nByte;
  long lVar1;
  undefined8 in_RAX;
  ulong uVar2;
  char *zString;
  int iStack_20;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if ((*(int *)((long)pUserData + 0x3f0) == 0) ||
     (lVar1 = *(long *)((long)pUserData + 1000), lVar1 == 0)) {
    zString = ":MEMORY:";
    iStack_20 = 8;
    nLen = iStack_20;
  }
  else {
    uVar2 = (ulong)(uint)((*(int *)((long)pUserData + 0x3f0) + -1) *
                         *(int *)((long)pUserData + 0x3f8));
    nByte = *(int *)(lVar1 + 8 + uVar2);
    if (nByte == 0) {
      zString = ".";
      iStack_20 = 1;
      nLen = iStack_20;
    }
    else {
      zString = jx9ExtractDirName(*(char **)(lVar1 + uVar2),nByte,&nLen);
    }
  }
  jx9_value_string(pVal,zString,nLen);
  return;
}

Assistant:

static void JX9_DIR_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		if( pFile->nByte > 0 ){
			const char *zDir;
			int nLen;
			zDir = jx9ExtractDirName(pFile->zString, (int)pFile->nByte, &nLen);
			jx9_value_string(pVal, zDir, nLen);
		}else{
			/* Expand '.' as the current directory*/
			jx9_value_string(pVal, ".", (int)sizeof(char));
		}
	}
}